

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O0

string * __thiscall
cmProcess::GetExitExceptionString_abi_cxx11_(string *__return_storage_ptr__,cmProcess *this)

{
  string local_50;
  undefined1 local_19;
  cmProcess *local_18;
  cmProcess *this_local;
  string *exception_str;
  
  local_19 = 0;
  local_18 = this;
  this_local = (cmProcess *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch(this->Signal) {
  case 1:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGHUP");
    break;
  case 2:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"User interrupt");
    break;
  case 3:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGQUIT");
    break;
  case 4:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Illegal instruction");
    break;
  case 5:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGTRAP");
    break;
  case 6:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Child aborted");
    break;
  case 7:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Bus error");
    break;
  case 8:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Floating-point exception");
    break;
  case 9:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Child killed");
    break;
  case 10:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGUSR1");
    break;
  case 0xb:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Segmentation fault");
    break;
  case 0xc:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGUSR2");
    break;
  case 0xd:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGPIPE");
    break;
  case 0xe:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGALRM");
    break;
  case 0xf:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Child terminated");
    break;
  case 0x10:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGSTKFLT");
    break;
  case 0x11:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGCHLD");
    break;
  case 0x12:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGCONT");
    break;
  case 0x13:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGSTOP");
    break;
  case 0x14:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGTSTP");
    break;
  case 0x15:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGTTIN");
    break;
  case 0x16:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGTTOU");
    break;
  case 0x17:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGURG");
    break;
  case 0x18:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGXCPU");
    break;
  case 0x19:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGXFSZ");
    break;
  case 0x1a:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGVTALRM");
    break;
  case 0x1b:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGPROF");
    break;
  case 0x1c:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGWINCH");
    break;
  case 0x1d:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGPOLL");
    break;
  case 0x1e:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGPWR");
    break;
  case 0x1f:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SIGSYS");
    break;
  default:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Signal ");
    std::__cxx11::to_string(&local_50,this->Signal);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmProcess::GetExitExceptionString()
{
  std::string exception_str;
#if defined(_WIN32)
  switch (this->ExitValue) {
    case STATUS_CONTROL_C_EXIT:
      exception_str = "User interrupt";
      break;
    case STATUS_FLOAT_DENORMAL_OPERAND:
      exception_str = "Floating-point exception (denormal operand)";
      break;
    case STATUS_FLOAT_DIVIDE_BY_ZERO:
      exception_str = "Divide-by-zero";
      break;
    case STATUS_FLOAT_INEXACT_RESULT:
      exception_str = "Floating-point exception (inexact result)";
      break;
    case STATUS_FLOAT_INVALID_OPERATION:
      exception_str = "Invalid floating-point operation";
      break;
    case STATUS_FLOAT_OVERFLOW:
      exception_str = "Floating-point overflow";
      break;
    case STATUS_FLOAT_STACK_CHECK:
      exception_str = "Floating-point stack check failed";
      break;
    case STATUS_FLOAT_UNDERFLOW:
      exception_str = "Floating-point underflow";
      break;
#  ifdef STATUS_FLOAT_MULTIPLE_FAULTS
    case STATUS_FLOAT_MULTIPLE_FAULTS:
      exception_str = "Floating-point exception (multiple faults)";
      break;
#  endif
#  ifdef STATUS_FLOAT_MULTIPLE_TRAPS
    case STATUS_FLOAT_MULTIPLE_TRAPS:
      exception_str = "Floating-point exception (multiple traps)";
      break;
#  endif
    case STATUS_INTEGER_DIVIDE_BY_ZERO:
      exception_str = "Integer divide-by-zero";
      break;
    case STATUS_INTEGER_OVERFLOW:
      exception_str = "Integer overflow";
      break;

    case STATUS_DATATYPE_MISALIGNMENT:
      exception_str = "Datatype misalignment";
      break;
    case STATUS_ACCESS_VIOLATION:
      exception_str = "Access violation";
      break;
    case STATUS_IN_PAGE_ERROR:
      exception_str = "In-page error";
      break;
    case STATUS_INVALID_HANDLE:
      exception_str = "Invalid handle";
      break;
    case STATUS_NONCONTINUABLE_EXCEPTION:
      exception_str = "Noncontinuable exception";
      break;
    case STATUS_INVALID_DISPOSITION:
      exception_str = "Invalid disposition";
      break;
    case STATUS_ARRAY_BOUNDS_EXCEEDED:
      exception_str = "Array bounds exceeded";
      break;
    case STATUS_STACK_OVERFLOW:
      exception_str = "Stack overflow";
      break;

    case STATUS_ILLEGAL_INSTRUCTION:
      exception_str = "Illegal instruction";
      break;
    case STATUS_PRIVILEGED_INSTRUCTION:
      exception_str = "Privileged instruction";
      break;
    case STATUS_NO_MEMORY:
    default:
      char buf[1024];
      const char* fmt = "Exit code 0x%" KWIML_INT_PRIx64 "\n";
      _snprintf(buf, 1024, fmt, this->ExitValue);
      exception_str.assign(buf);
  }
#else
  switch (this->Signal) {
#  ifdef SIGSEGV
    case SIGSEGV:
      exception_str = "Segmentation fault";
      break;
#  endif
#  ifdef SIGBUS
#    if !defined(SIGSEGV) || SIGBUS != SIGSEGV
    case SIGBUS:
      exception_str = "Bus error";
      break;
#    endif
#  endif
#  ifdef SIGFPE
    case SIGFPE:
      exception_str = "Floating-point exception";
      break;
#  endif
#  ifdef SIGILL
    case SIGILL:
      exception_str = "Illegal instruction";
      break;
#  endif
#  ifdef SIGINT
    case SIGINT:
      exception_str = "User interrupt";
      break;
#  endif
#  ifdef SIGABRT
    case SIGABRT:
      exception_str = "Child aborted";
      break;
#  endif
#  ifdef SIGKILL
    case SIGKILL:
      exception_str = "Child killed";
      break;
#  endif
#  ifdef SIGTERM
    case SIGTERM:
      exception_str = "Child terminated";
      break;
#  endif
#  ifdef SIGHUP
    case SIGHUP:
      exception_str = "SIGHUP";
      break;
#  endif
#  ifdef SIGQUIT
    case SIGQUIT:
      exception_str = "SIGQUIT";
      break;
#  endif
#  ifdef SIGTRAP
    case SIGTRAP:
      exception_str = "SIGTRAP";
      break;
#  endif
#  ifdef SIGIOT
#    if !defined(SIGABRT) || SIGIOT != SIGABRT
    case SIGIOT:
      exception_str = "SIGIOT";
      break;
#    endif
#  endif
#  ifdef SIGUSR1
    case SIGUSR1:
      exception_str = "SIGUSR1";
      break;
#  endif
#  ifdef SIGUSR2
    case SIGUSR2:
      exception_str = "SIGUSR2";
      break;
#  endif
#  ifdef SIGPIPE
    case SIGPIPE:
      exception_str = "SIGPIPE";
      break;
#  endif
#  ifdef SIGALRM
    case SIGALRM:
      exception_str = "SIGALRM";
      break;
#  endif
#  ifdef SIGSTKFLT
    case SIGSTKFLT:
      exception_str = "SIGSTKFLT";
      break;
#  endif
#  ifdef SIGCHLD
    case SIGCHLD:
      exception_str = "SIGCHLD";
      break;
#  elif defined(SIGCLD)
    case SIGCLD:
      exception_str = "SIGCLD";
      break;
#  endif
#  ifdef SIGCONT
    case SIGCONT:
      exception_str = "SIGCONT";
      break;
#  endif
#  ifdef SIGSTOP
    case SIGSTOP:
      exception_str = "SIGSTOP";
      break;
#  endif
#  ifdef SIGTSTP
    case SIGTSTP:
      exception_str = "SIGTSTP";
      break;
#  endif
#  ifdef SIGTTIN
    case SIGTTIN:
      exception_str = "SIGTTIN";
      break;
#  endif
#  ifdef SIGTTOU
    case SIGTTOU:
      exception_str = "SIGTTOU";
      break;
#  endif
#  ifdef SIGURG
    case SIGURG:
      exception_str = "SIGURG";
      break;
#  endif
#  ifdef SIGXCPU
    case SIGXCPU:
      exception_str = "SIGXCPU";
      break;
#  endif
#  ifdef SIGXFSZ
    case SIGXFSZ:
      exception_str = "SIGXFSZ";
      break;
#  endif
#  ifdef SIGVTALRM
    case SIGVTALRM:
      exception_str = "SIGVTALRM";
      break;
#  endif
#  ifdef SIGPROF
    case SIGPROF:
      exception_str = "SIGPROF";
      break;
#  endif
#  ifdef SIGWINCH
    case SIGWINCH:
      exception_str = "SIGWINCH";
      break;
#  endif
#  ifdef SIGPOLL
    case SIGPOLL:
      exception_str = "SIGPOLL";
      break;
#  endif
#  ifdef SIGIO
#    if !defined(SIGPOLL) || SIGIO != SIGPOLL
    case SIGIO:
      exception_str = "SIGIO";
      break;
#    endif
#  endif
#  ifdef SIGPWR
    case SIGPWR:
      exception_str = "SIGPWR";
      break;
#  endif
#  ifdef SIGSYS
    case SIGSYS:
      exception_str = "SIGSYS";
      break;
#  endif
#  ifdef SIGUNUSED
#    if !defined(SIGSYS) || SIGUNUSED != SIGSYS
    case SIGUNUSED:
      exception_str = "SIGUNUSED";
      break;
#    endif
#  endif
    default:
      exception_str = "Signal ";
      exception_str += std::to_string(this->Signal);
  }
#endif
  return exception_str;
}